

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.h
# Opt level: O0

vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
* __thiscall
spvtools::opt::ConstantFoldingRules::GetRulesForInstruction
          (ConstantFoldingRules *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  pointer pvVar3;
  pointer ppVar4;
  _Self local_58;
  key_type local_50;
  _Self local_48;
  const_iterator it_1;
  uint32_t ext_opcode;
  uint32_t ext_inst_id;
  Op local_2c;
  _Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
  local_28;
  const_iterator it;
  Instruction *inst_local;
  ConstantFoldingRules *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
             )(_Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
               )inst;
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 == OpExtInst) {
    it_1._M_node._4_4_ =
         opt::Instruction::GetSingleWordInOperand
                   ((Instruction *)
                    it.
                    super__Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
                    ._M_cur,0);
    local_50.opcode =
         opt::Instruction::GetSingleWordInOperand
                   ((Instruction *)
                    it.
                    super__Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
                    ._M_cur,1);
    local_50.instruction_set = it_1._M_node._4_4_;
    it_1._M_node._0_4_ = local_50.opcode;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
         ::find(&this->ext_rules_,&local_50);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
         ::end(&this->ext_rules_);
    bVar1 = std::operator!=(&local_48,&local_58);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>
               ::operator->(&local_48);
      return &(ppVar4->second).value;
    }
  }
  else {
    local_2c = opt::Instruction::opcode
                         ((Instruction *)
                          it.
                          super__Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
                          ._M_cur);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
         ::find(&this->rules_,&local_2c);
    _ext_opcode = (__node_type *)
                  std::
                  unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
                  ::end(&this->rules_);
    bVar1 = std::__detail::operator!=
                      (&local_28,
                       (_Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
                        *)&ext_opcode);
    if (bVar1) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false,_false>
                             *)&local_28);
      return &(pvVar3->second).value;
    }
  }
  return &this->empty_vector_;
}

Assistant:

const std::vector<ConstantFoldingRule>& GetRulesForInstruction(
      const Instruction* inst) const {
    if (inst->opcode() != spv::Op::OpExtInst) {
      auto it = rules_.find(inst->opcode());
      if (it != rules_.end()) {
        return it->second.value;
      }
    } else {
      uint32_t ext_inst_id = inst->GetSingleWordInOperand(0);
      uint32_t ext_opcode = inst->GetSingleWordInOperand(1);
      auto it = ext_rules_.find({ext_inst_id, ext_opcode});
      if (it != ext_rules_.end()) {
        return it->second.value;
      }
    }
    return empty_vector_;
  }